

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_setopt(CURLM *m,CURLMoption option,...)

{
  ulong local_f8;
  undefined4 local_50;
  long streams;
  Curl_multi *multi;
  unsigned_long uarg;
  va_list param;
  CURLMcode res;
  CURLMoption option_local;
  CURLM *m_local;
  
  param[0].reg_save_area._0_4_ = CURLM_OK;
  if ((m == (CURLM *)0x0) || (*m != 0xbab1e)) {
    m_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((*(byte *)((long)m + 0x271) >> 2 & 1) == 0) {
    if (option == CURLMOPT_PIPELINING) {
      param[0].reg_save_area._0_4_ = CURLM_OK;
      *(byte *)((long)m + 0x271) = *(byte *)((long)m + 0x271) & 0xfe | (local_f8 & 2) != 0;
    }
    else {
      local_50 = (undefined4)local_f8;
      if (option == CURLMOPT_MAXCONNECTS) {
        param[0].reg_save_area._0_4_ = CURLM_OK;
        if (local_f8 < 0x100000000) {
          *(undefined4 *)((long)m + 0x26c) = local_50;
        }
      }
      else if (option == CURLMOPT_MAX_HOST_CONNECTIONS) {
        param[0].reg_save_area._0_4_ = CURLM_OK;
        *(ulong *)((long)m + 0x228) = local_f8;
      }
      else if (option != CURLMOPT_MAX_PIPELINE_LENGTH) {
        if (option == CURLMOPT_MAX_TOTAL_CONNECTIONS) {
          param[0].reg_save_area._0_4_ = CURLM_OK;
          *(ulong *)((long)m + 0x230) = local_f8;
        }
        else if (option == CURLMOPT_MAX_CONCURRENT_STREAMS) {
          param[0].reg_save_area._0_4_ = CURLM_OK;
          if (((long)local_f8 < 1) || (0x7fffffff < (long)local_f8)) {
            local_50 = 100;
          }
          *(undefined4 *)((long)m + 0x268) = local_50;
        }
        else if (option == CURLMOPT_SOCKETDATA) {
          param[0].reg_save_area._0_4_ = CURLM_OK;
          *(ulong *)((long)m + 0x88) = local_f8;
        }
        else if (option == CURLMOPT_TIMERDATA) {
          param[0].reg_save_area._0_4_ = CURLM_OK;
          *(ulong *)((long)m + 0x240) = local_f8;
        }
        else if ((option != CURLMOPT_PIPELINING_SITE_BL) &&
                (option != CURLMOPT_PIPELINING_SERVER_BL)) {
          if (option == CURLMOPT_PUSHDATA) {
            param[0].reg_save_area._0_4_ = CURLM_OK;
            *(ulong *)((long)m + 0x98) = local_f8;
          }
          else if (option == CURLMOPT_SOCKETFUNCTION) {
            param[0].reg_save_area._0_4_ = CURLM_OK;
            *(ulong *)((long)m + 0x80) = local_f8;
          }
          else if (option == CURLMOPT_TIMERFUNCTION) {
            param[0].reg_save_area._0_4_ = CURLM_OK;
            *(ulong *)((long)m + 0x238) = local_f8;
          }
          else if (option == CURLMOPT_PUSHFUNCTION) {
            param[0].reg_save_area._0_4_ = CURLM_OK;
            *(ulong *)((long)m + 0x90) = local_f8;
          }
          else if ((option != CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE) &&
                  (option != CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE)) {
            param[0].reg_save_area._0_4_ = CURLM_UNKNOWN_OPTION;
          }
        }
      }
    }
    m_local._4_4_ = (CURLMcode)param[0].reg_save_area;
  }
  else {
    m_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return m_local._4_4_;
}

Assistant:

CURLMcode curl_multi_setopt(CURLM *m,
                            CURLMoption option, ...)
{
  CURLMcode res = CURLM_OK;
  va_list param;
  unsigned long uarg;
  struct Curl_multi *multi = m;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  va_start(param, option);

  switch(option) {
  case CURLMOPT_SOCKETFUNCTION:
    multi->socket_cb = va_arg(param, curl_socket_callback);
    break;
  case CURLMOPT_SOCKETDATA:
    multi->socket_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PUSHFUNCTION:
    multi->push_cb = va_arg(param, curl_push_callback);
    break;
  case CURLMOPT_PUSHDATA:
    multi->push_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PIPELINING:
    multi->multiplexing = va_arg(param, long) & CURLPIPE_MULTIPLEX ? 1 : 0;
    break;
  case CURLMOPT_TIMERFUNCTION:
    multi->timer_cb = va_arg(param, curl_multi_timer_callback);
    break;
  case CURLMOPT_TIMERDATA:
    multi->timer_userp = va_arg(param, void *);
    break;
  case CURLMOPT_MAXCONNECTS:
    uarg = va_arg(param, unsigned long);
    if(uarg <= UINT_MAX)
      multi->maxconnects = (unsigned int)uarg;
    break;
  case CURLMOPT_MAX_HOST_CONNECTIONS:
    multi->max_host_connections = va_arg(param, long);
    break;
  case CURLMOPT_MAX_TOTAL_CONNECTIONS:
    multi->max_total_connections = va_arg(param, long);
    break;
    /* options formerly used for pipelining */
  case CURLMOPT_MAX_PIPELINE_LENGTH:
    break;
  case CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE:
    break;
  case CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE:
    break;
  case CURLMOPT_PIPELINING_SITE_BL:
    break;
  case CURLMOPT_PIPELINING_SERVER_BL:
    break;
  case CURLMOPT_MAX_CONCURRENT_STREAMS:
    {
      long streams = va_arg(param, long);
      if((streams < 1) || (streams > INT_MAX))
        streams = 100;
      multi->max_concurrent_streams = (unsigned int)streams;
    }
    break;
  default:
    res = CURLM_UNKNOWN_OPTION;
    break;
  }
  va_end(param);
  return res;
}